

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void __thiscall ftxui::Frame::SetBox(Frame *this,Box box)

{
  int *piVar1;
  __shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  int local_78 [3];
  int local_6c;
  int dy;
  int focused_dimy;
  int internal_dimy;
  int external_dimy;
  int local_58;
  int local_54;
  int dx;
  int focused_dimx;
  int internal_dimx;
  int external_dimx;
  Box children_box;
  Box *selected_box;
  Frame *this_local;
  Box box_local;
  
  Node::SetBox(&this->super_Node,box);
  children_box._8_8_ = &(this->super_Node).requirement_.selected_box;
  _internal_dimx = box._0_8_;
  children_box._0_8_ = box._8_8_;
  if (((this->super_Node).field_0x5c & 1) != 0) {
    this_local._4_4_ = box.x_max;
    this_local._0_4_ = box.x_min;
    focused_dimx = this_local._4_4_ - (int)this_local;
    piVar1 = std::max<int>(&(this->super_Node).requirement_.min_x,&focused_dimx);
    dx = *piVar1;
    local_54 = *(int *)(children_box._8_8_ + 4) - *(int *)children_box._8_8_;
    local_58 = (*(int *)children_box._8_8_ - focused_dimx / 2) + local_54 / 2;
    external_dimy = 0;
    internal_dimy = (dx - focused_dimx) + -1;
    piVar1 = std::min<int>(&internal_dimy,&local_58);
    piVar1 = std::max<int>(&external_dimy,piVar1);
    local_58 = *piVar1;
    _internal_dimx = CONCAT44(((int)this_local + dx) - local_58,(int)this_local - local_58);
  }
  if (((this->super_Node).field_0x5d & 1) != 0) {
    box_local.x_max = box.y_max;
    box_local.x_min = box.y_min;
    focused_dimy = box_local.x_max - box_local.x_min;
    piVar1 = std::max<int>(&(this->super_Node).requirement_.min_y,&focused_dimy);
    dy = *piVar1;
    local_6c = *(int *)(children_box._8_8_ + 0xc) - *(int *)(children_box._8_8_ + 8);
    local_78[2] = (*(int *)(children_box._8_8_ + 8) - focused_dimy / 2) + local_6c / 2;
    local_78[1] = 0;
    local_78[0] = (dy - focused_dimy) + -1;
    piVar1 = std::min<int>(local_78,local_78 + 2);
    piVar1 = std::max<int>(local_78 + 1,piVar1);
    local_78[2] = *piVar1;
    children_box.x_max = (box_local.x_min + dy) - local_78[2];
    children_box.x_min = box_local.x_min - local_78[2];
  }
  this_00 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
            operator[](&(this->super_Node).children_,0);
  peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(this_00);
  (*peVar2->_vptr_Node[3])(peVar2,_internal_dimx,children_box._0_8_);
  return;
}

Assistant:

void SetBox(Box box) override {
    Node::SetBox(box);
    auto& selected_box = requirement_.selected_box;
    Box children_box = box;

    if (x_frame_) {
      int external_dimx = box.x_max - box.x_min;
      int internal_dimx = std::max(requirement_.min_x, external_dimx);
      int focused_dimx = selected_box.x_max - selected_box.x_min;
      int dx = selected_box.x_min - external_dimx / 2 + focused_dimx / 2;
      dx = std::max(0, std::min(internal_dimx - external_dimx - 1, dx));
      children_box.x_min = box.x_min - dx;
      children_box.x_max = box.x_min + internal_dimx - dx;
    }

    if (y_frame_) {
      int external_dimy = box.y_max - box.y_min;
      int internal_dimy = std::max(requirement_.min_y, external_dimy);
      int focused_dimy = selected_box.y_max - selected_box.y_min;
      int dy = selected_box.y_min - external_dimy / 2 + focused_dimy / 2;
      dy = std::max(0, std::min(internal_dimy - external_dimy - 1, dy));
      children_box.y_min = box.y_min - dy;
      children_box.y_max = box.y_min + internal_dimy - dy;
    }

    children_[0]->SetBox(children_box);
  }